

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_fork.c
# Opt level: O1

int metacall_fork_destroy(void)

{
  int iVar1;
  uint uVar2;
  char *name;
  detour d;
  
  if (detour_fork_handle == (detour_handle)0x0) {
    uVar2 = 0;
  }
  else {
    name = metacall_detour();
    d = detour_create(name);
    iVar1 = detour_uninstall(d,detour_fork_handle);
    if (iVar1 != 0) {
      log_write_impl_va("metacall",0x13f,"metacall_fork_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_fork.c"
                        ,LOG_LEVEL_ERROR,"MetaCall invalid detour fork uninstall");
    }
    uVar2 = (uint)(iVar1 != 0);
    detour_fork_handle = (detour_handle)0x0;
  }
  metacall_pre_fork_callback = (metacall_pre_fork_callback_ptr)0x0;
  metacall_post_fork_callback = (metacall_post_fork_callback_ptr)0x0;
  return uVar2;
}

Assistant:

int metacall_fork_destroy(void)
{
	int result = 0;

	if (detour_fork_handle != NULL)
	{
		detour d = detour_create(metacall_detour());

		if (detour_uninstall(d, detour_fork_handle) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall invalid detour fork uninstall");

			result = 1;
		}

		detour_fork_handle = NULL;
	}

	metacall_pre_fork_callback = NULL;
	metacall_post_fork_callback = NULL;

	return result;
}